

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  Vector<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  int i;
  int index;
  
  if (0x1b < shift_amount) {
    __assert_fail("shift_amount < kBigitSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x2d3,"void FIX::double_conversion::Bignum::BigitsShiftLeft(int)");
  }
  if (-1 < shift_amount) {
    this_00 = &this->bigits_;
    uVar4 = 0;
    for (index = 0; index < this->used_digits_; index = index + 1) {
      puVar3 = Vector<unsigned_int>::operator[](this_00,index);
      uVar1 = *puVar3;
      puVar3 = Vector<unsigned_int>::operator[](this_00,index);
      uVar2 = *puVar3;
      puVar3 = Vector<unsigned_int>::operator[](this_00,index);
      *puVar3 = (uVar2 << ((byte)shift_amount & 0x1f)) + uVar4 & 0xfffffff;
      uVar4 = uVar1 >> (0x1c - (byte)shift_amount & 0x1f);
    }
    if (uVar4 != 0) {
      puVar3 = Vector<unsigned_int>::operator[](this_00,this->used_digits_);
      *puVar3 = uVar4;
      this->used_digits_ = this->used_digits_ + 1;
    }
    return;
  }
  __assert_fail("shift_amount >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                ,0x2d4,"void FIX::double_conversion::Bignum::BigitsShiftLeft(int)");
}

Assistant:

void Bignum::BigitsShiftLeft(int shift_amount) {
  ASSERT(shift_amount < kBigitSize);
  ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    Chunk new_carry = bigits_[i] >> (kBigitSize - shift_amount);
    bigits_[i] = ((bigits_[i] << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    bigits_[used_digits_] = carry;
    used_digits_++;
  }
}